

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

string * __thiscall
cmFileAPI::ObjectName_abi_cxx11_(string *__return_storage_ptr__,cmFileAPI *this,Object *o)

{
  char *__s;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_80;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  char *local_38;
  size_t local_30;
  char *pcStack_28;
  
  __s = ObjectKindName::objectKindNames[*(int *)&this->CMakeInstance];
  local_50._M_len = strlen(__s);
  local_40 = 2;
  local_38 = "-v";
  local_50._M_str = __s;
  cmAlphaNum::cmAlphaNum(&local_80,(unsigned_long)(this->APIv1)._M_dataplus._M_p);
  local_30 = local_80.View_._M_len;
  pcStack_28 = local_80.View_._M_str;
  views._M_len = 3;
  views._M_array = &local_50;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::ObjectName(Object const& o)
{
  std::string name = cmStrCat(ObjectKindName(o.Kind), "-v", o.Version);
  return name;
}